

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O2

bool are_bool_matrices_equal(bool *matrix1,bool *matrix2,int width,int height)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (uVar2 == (uint)(~(height >> 0x1f) & height)) {
LAB_001547a4:
      return (long)height <= (long)uVar2;
    }
    for (uVar1 = 0; (uint)(~(width >> 0x1f) & width) != uVar1; uVar1 = uVar1 + 1) {
      if (matrix1[uVar1] != matrix2[uVar1]) {
        printf("DIFFERENCE LAPLACIAN: (%i, %i)\n",uVar2 & 0xffffffff);
        goto LAB_001547a4;
      }
    }
    uVar2 = uVar2 + 1;
    matrix1 = matrix1 + width;
    matrix2 = matrix2 + width;
  } while( true );
}

Assistant:

inline bool are_bool_matrices_equal(bool *matrix1, bool *matrix2, int width, int height) {
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            if (matrix1[i * width + j] != matrix2[i * width + j]) {
                printf("DIFFERENCE LAPLACIAN: (%i, %i)\n", i, j);
                return false;
            }
        }
    }
    return true;
}